

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::_internal_add_extractindex
          (ArrayFeatureExtractor *this,uint64_t value)

{
  uint64_t local_18;
  uint64_t value_local;
  ArrayFeatureExtractor *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->extractindex_,&local_18);
  return;
}

Assistant:

inline void ArrayFeatureExtractor::_internal_add_extractindex(uint64_t value) {
  extractindex_.Add(value);
}